

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void add_sampler(Context *ctx,int regnum,TextureType ttype,int texbem)

{
  MOJOSHADER_samplerMap *pMVar1;
  ulong uVar2;
  RegisterList *pRVar3;
  ulong uVar4;
  
  pRVar3 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
  pMVar1 = ctx->samplermap;
  if (pMVar1 != (MOJOSHADER_samplerMap *)0x0) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (ctx->samplermap_count == uVar4) goto LAB_0011968b;
      uVar2 = uVar4 + 1;
    } while (pMVar1[uVar4].index != regnum);
    ttype = pMVar1[uVar4].type + TEXTURE_TYPE_2D;
  }
LAB_0011968b:
  pRVar3->index = ttype;
  pRVar3->misc = pRVar3->misc | texbem;
  return;
}

Assistant:

static inline void add_sampler(Context *ctx, const int regnum,
                               TextureType ttype, const int texbem)
{
    const RegisterType rtype = REG_TYPE_SAMPLER;

    // !!! FIXME: make sure it doesn't exist?
    // !!! FIXME:  (ps_1_1 assume we can add it multiple times...)
    RegisterList *item = reglist_insert(ctx, &ctx->samplers, rtype, regnum);

    if (ctx->samplermap != NULL)
    {
        unsigned int i;
        for (i = 0; i < ctx->samplermap_count; i++)
        {
            if (ctx->samplermap[i].index == regnum)
            {
                ttype = cvtMojoToD3DSamplerType(ctx->samplermap[i].type);
                break;
            } // if
        } // for
    } // if

    item->index = (int) ttype;
    item->misc |= texbem;
}